

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::maxwell_dist<float>::cdf(maxwell_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  double dVar3;
  double dVar4;
  
  rVar1 = param_type::theta(in_RDI);
  dVar3 = std::erf((double)(ulong)(uint)((in_XMM0_Da * 0.70710677) / rVar1));
  rVar1 = param_type::theta(in_RDI);
  rVar2 = param_type::theta(in_RDI);
  dVar4 = std::exp((double)(ulong)(uint)((-in_XMM0_Da * in_XMM0_Da) / (rVar1 * 2.0 * rVar2)));
  rVar1 = param_type::theta(in_RDI);
  return SUB84(dVar3,0) - (in_XMM0_Da * 0.7978846 * SUB84(dVar4,0)) / rVar1;
}

Assistant:

cdf(result_type x) const {
      return math::erf(x * math::constants<result_type>::one_over_sqrt_2 / P.theta()) -
             math::constants<result_type>::sqrt_2_over_pi * x *
                 math::exp(-x * x / (2 * P.theta() * P.theta())) / (P.theta());
    }